

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpackingaligned.cpp
# Opt level: O1

uint32_t * FastPForLib::__fastpackwithoutmask3_16(uint32_t *in,uint32_t *out)

{
  uint uVar1;
  uint uVar2;
  
  uVar2 = *in;
  *out = uVar2;
  uVar2 = in[1] << 3 | uVar2;
  *out = uVar2;
  uVar2 = in[2] << 6 | uVar2;
  *out = uVar2;
  uVar2 = in[3] << 9 | uVar2;
  *out = uVar2;
  uVar2 = in[4] << 0xc | uVar2;
  *out = uVar2;
  uVar2 = in[5] << 0xf | uVar2;
  *out = uVar2;
  uVar2 = in[6] << 0x12 | uVar2;
  *out = uVar2;
  uVar2 = in[7] << 0x15 | uVar2;
  *out = uVar2;
  uVar2 = in[8] << 0x18 | uVar2;
  *out = uVar2;
  uVar2 = in[9] << 0x1b | uVar2;
  *out = uVar2;
  uVar1 = in[10];
  *out = uVar1 << 0x1e | uVar2;
  uVar1 = uVar1 >> 2;
  out[1] = uVar1;
  uVar1 = in[0xb] * 2 | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xc] << 4 | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xd] << 7 | uVar1;
  out[1] = uVar1;
  uVar1 = in[0xe] << 10 | uVar1;
  out[1] = uVar1;
  out[1] = in[0xf] << 0xd | uVar1;
  return out + 2;
}

Assistant:

uint32_t *__fastpackwithoutmask3_16(const uint32_t *__restrict__ in,
                                    uint32_t *__restrict__ out) {

  *out = (*in);
  ++in;
  *out |= ((*in)) << 3;
  ++in;
  *out |= ((*in)) << 6;
  ++in;
  *out |= ((*in)) << 9;
  ++in;
  *out |= ((*in)) << 12;
  ++in;
  *out |= ((*in)) << 15;
  ++in;
  *out |= ((*in)) << 18;
  ++in;
  *out |= ((*in)) << 21;
  ++in;
  *out |= ((*in)) << 24;
  ++in;
  *out |= ((*in)) << 27;
  ++in;
  *out |= ((*in)) << 30;
  ++out;
  *out = ((*in)) >> (3 - 1);
  ++in;
  *out |= ((*in)) << 1;
  ++in;
  *out |= ((*in)) << 4;
  ++in;
  *out |= ((*in)) << 7;
  ++in;
  *out |= ((*in)) << 10;
  ++in;
  *out |= ((*in)) << 13;
  ++in;

  return out + 1;
}